

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeStorage(ImGuiStorage *storage,char *label)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ImGuiStoragePair *pIVar4;
  char *in_RSI;
  ImVector<ImGuiStoragePair> *in_RDI;
  ImGuiID in_stack_00000014;
  ImGuiStoragePair *p;
  ImGuiStoragePair *__end1;
  ImGuiStoragePair *__begin1;
  ImVector<ImGuiStoragePair> *__range1;
  ImGuiStoragePair *local_20;
  
  uVar1 = in_RDI->Size;
  uVar3 = ImVector<ImGuiStoragePair>::size_in_bytes(in_RDI);
  bVar2 = TreeNode(in_RSI,"%s: %d entries, %d bytes",in_RSI,(ulong)uVar1,(ulong)uVar3);
  if (bVar2) {
    local_20 = ImVector<ImGuiStoragePair>::begin(in_RDI);
    pIVar4 = ImVector<ImGuiStoragePair>::end(in_RDI);
    for (; local_20 != pIVar4; local_20 = local_20 + 1) {
      BulletText("Key 0x%08X Value { i: %d }",(ulong)local_20->key,
                 (ulong)(uint)(local_20->field_1).val_i);
      DebugLocateItemOnHover(in_stack_00000014);
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeStorage(ImGuiStorage* storage, const char* label)
{
    if (!TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
        return;
    for (const ImGuiStoragePair& p : storage->Data)
    {
        BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
        DebugLocateItemOnHover(p.key);
    }
    TreePop();
}